

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
          (RepeatedPtrFieldBase *this,int extend_amount)

{
  int *piVar1;
  long lVar2;
  unsigned_long uVar3;
  LogMessage *pLVar4;
  ulong num_elements;
  Rep *pRVar5;
  size_t bytes;
  byte local_71;
  LogMessage local_70;
  int local_34;
  Arena *local_30;
  Arena *arena;
  Rep *old_rep;
  int new_size;
  int extend_amount_local;
  RepeatedPtrFieldBase *this_local;
  
  old_rep._0_4_ = this->current_size_ + extend_amount;
  if (this->total_size_ < (int)old_rep) {
    arena = (Arena *)this->rep_;
    old_rep._4_4_ = extend_amount;
    _new_size = this;
    local_30 = GetArena(this);
    local_34 = this->total_size_ << 1;
    piVar1 = std::max<int>(&local_34,(int *)&old_rep);
    piVar1 = std::max<int>(&kRepeatedFieldLowerClampLimit,piVar1);
    old_rep._0_4_ = *piVar1;
    lVar2 = (long)(int)old_rep;
    uVar3 = std::numeric_limits<unsigned_long>::max();
    local_71 = 0;
    if ((long)(uVar3 - 8 >> 3) < lVar2) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.cc"
                 ,0x40);
      local_71 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (static_cast<int64_t>(new_size)) <= (static_cast<int64_t>( (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(old_rep->elements[0]))): "
                         );
      pLVar4 = LogMessage::operator<<(pLVar4,"Requested size is too large to fit into size_t.");
      LogFinisher::operator=((LogFinisher *)((long)&bytes + 3),pLVar4);
    }
    if ((local_71 & 1) != 0) {
      LogMessage::~LogMessage(&local_70);
    }
    num_elements = (long)(int)old_rep * 8 + 8;
    if (local_30 == (Arena *)0x0) {
      pRVar5 = (Rep *)operator_new(num_elements);
      this->rep_ = pRVar5;
    }
    else {
      pRVar5 = (Rep *)Arena::CreateArray<char>(local_30,num_elements);
      this->rep_ = pRVar5;
    }
    this->total_size_ = (int)old_rep;
    if ((arena == (Arena *)0x0) || (*(int *)arena < 1)) {
      this->rep_->allocated_size = 0;
    }
    else {
      memcpy(this->rep_->elements,arena + 8,(long)*(int *)arena << 3);
      this->rep_->allocated_size = *(int *)arena;
    }
    if (local_30 == (Arena *)0x0) {
      operator_delete(arena);
    }
    this_local = (RepeatedPtrFieldBase *)(this->rep_->elements + this->current_size_);
  }
  else {
    this_local = (RepeatedPtrFieldBase *)(this->rep_->elements + this->current_size_);
  }
  return &this_local->arena_;
}

Assistant:

void** RepeatedPtrFieldBase::InternalExtend(int extend_amount) {
  int new_size = current_size_ + extend_amount;
  if (total_size_ >= new_size) {
    // N.B.: rep_ is non-nullptr because extend_amount is always > 0, hence
    // total_size must be non-zero since it is lower-bounded by new_size.
    return &rep_->elements[current_size_];
  }
  Rep* old_rep = rep_;
  Arena* arena = GetArena();
  new_size = std::max(internal::kRepeatedFieldLowerClampLimit,
                      std::max(total_size_ * 2, new_size));
  GOOGLE_CHECK_LE(static_cast<int64_t>(new_size),
           static_cast<int64_t>(
               (std::numeric_limits<size_t>::max() - kRepHeaderSize) /
               sizeof(old_rep->elements[0])))
      << "Requested size is too large to fit into size_t.";
  size_t bytes = kRepHeaderSize + sizeof(old_rep->elements[0]) * new_size;
  if (arena == nullptr) {
    rep_ = reinterpret_cast<Rep*>(::operator new(bytes));
  } else {
    rep_ = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
  const int old_total_size = total_size_;
#endif
  total_size_ = new_size;
  if (old_rep && old_rep->allocated_size > 0) {
    memcpy(rep_->elements, old_rep->elements,
           old_rep->allocated_size * sizeof(rep_->elements[0]));
    rep_->allocated_size = old_rep->allocated_size;
  } else {
    rep_->allocated_size = 0;
  }
  if (arena == nullptr) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t old_size =
        old_total_size * sizeof(rep_->elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(old_rep), old_size);
#else
    ::operator delete(static_cast<void*>(old_rep));
#endif
  }
  return &rep_->elements[current_size_];
}